

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFEFStreamObjectHelper.cc
# Opt level: O0

QPDFObjectHandle __thiscall
QPDFEFStreamObjectHelper::getParam(QPDFEFStreamObjectHelper *this,string *pkey)

{
  bool bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle QVar2;
  allocator<char> local_81;
  string local_80 [48];
  undefined1 local_50 [32];
  undefined1 local_30 [8];
  QPDFObjectHandle params;
  string *pkey_local;
  QPDFEFStreamObjectHelper *this_local;
  
  QPDFObjectHelper::oh((QPDFObjectHelper *)local_50);
  QPDFObjectHandle::getDict((QPDFObjectHandle *)(local_50 + 0x10));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_80,"/Params",&local_81);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_30,(string *)(local_50 + 0x10));
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator(&local_81);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_50 + 0x10));
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_50);
  bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_30);
  if (bVar1) {
    QPDFObjectHandle::getKey((QPDFObjectHandle *)this,(string *)local_30);
  }
  else {
    QPDFObjectHandle::newNull();
  }
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_30);
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFEFStreamObjectHelper::getParam(std::string const& pkey)
{
    auto params = oh().getDict().getKey("/Params");
    if (params.isDictionary()) {
        return params.getKey(pkey);
    }
    return QPDFObjectHandle::newNull();
}